

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O2

void duckdb_vector_ensure_validity_writable(duckdb_vector vector)

{
  if (vector != (duckdb_vector)0x0) {
    duckdb::FlatVector::VerifyFlatVector((Vector *)vector);
    duckdb::TemplatedValidityMask<unsigned_long>::EnsureWritable
              ((TemplatedValidityMask<unsigned_long> *)(vector + 0x28));
    return;
  }
  return;
}

Assistant:

void duckdb_vector_ensure_validity_writable(duckdb_vector vector) {
	if (!vector) {
		return;
	}
	auto v = reinterpret_cast<duckdb::Vector *>(vector);
	auto &validity = duckdb::FlatVector::Validity(*v);
	validity.EnsureWritable();
}